

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O0

char * blogc_get_variable(char *name,bc_trie_t *global,bc_trie_t *local)

{
  char *local_30;
  char *rv;
  bc_trie_t *local_local;
  bc_trie_t *global_local;
  char *name_local;
  
  local_30 = (char *)0x0;
  if ((local == (bc_trie_t *)0x0) ||
     (local_30 = (char *)bc_trie_lookup(local,name), name_local = local_30, local_30 == (char *)0x0)
     ) {
    if (global != (bc_trie_t *)0x0) {
      local_30 = (char *)bc_trie_lookup(global,name);
    }
    name_local = local_30;
  }
  return name_local;
}

Assistant:

const char*
blogc_get_variable(const char *name, bc_trie_t *global, bc_trie_t *local)
{
    const char *rv = NULL;
    if (local != NULL) {
        rv = bc_trie_lookup(local, name);
        if (rv != NULL)
            return rv;
    }
    if (global != NULL)
        rv = bc_trie_lookup(global, name);
    return rv;
}